

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O0

void __thiscall wasm::ExecutionResults::check(ExecutionResults *this,Module *wasm)

{
  bool bVar1;
  undefined1 local_68 [8];
  ExecutionResults optimizedResults;
  Module *wasm_local;
  ExecutionResults *this_local;
  
  optimizedResults._72_8_ = wasm;
  ExecutionResults((ExecutionResults *)local_68);
  get((ExecutionResults *)local_68,(Module *)optimizedResults._72_8_);
  bVar1 = operator!=((ExecutionResults *)local_68,this);
  if (!bVar1) {
    ~ExecutionResults((ExecutionResults *)local_68);
    return;
  }
  std::operator<<((ostream *)&std::cout,"[fuzz-exec] optimization passes changed results\n");
  exit(1);
}

Assistant:

void check(Module& wasm) {
    ExecutionResults optimizedResults;
    optimizedResults.get(wasm);
    if (optimizedResults != *this) {
      std::cout << "[fuzz-exec] optimization passes changed results\n";
      exit(1);
    }
  }